

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

BasicBlock * __thiscall
FlowGraph::InsertCompensationCodeForBlockMove
          (FlowGraph *this,FlowEdge *edge,bool insertToLoopList,bool sinkBlockLoop,bool afterForward
          )

{
  RealCount *pRVar1;
  IRKind IVar2;
  OpCode OVar3;
  uint uVar4;
  BasicBlock *targetBlock;
  BasicBlock *pBVar5;
  BasicBlock *targetBlock_00;
  BranchInstr *this_00;
  LabelInstr *branchTarget;
  Func *func;
  code *pcVar6;
  bool bVar7;
  ExecutionMode EVar8;
  ushort uVar9;
  BOOL BVar10;
  BasicBlock *compBlock;
  BasicBlock *pBVar11;
  Type pSVar12;
  undefined4 *puVar13;
  LabelInstr *newLabelInstr;
  BranchInstr *this_01;
  MultiBranchInstr *this_02;
  Func **ppFVar14;
  char *pcVar15;
  undefined7 in_register_00000011;
  long lVar16;
  char *pcVar17;
  uint uVar18;
  Loop *pLVar19;
  char *pcVar20;
  BasicBlock *blNext;
  BranchInstr *sourceBr;
  
  compBlock = BasicBlock::New(this);
  targetBlock = edge->predBlock;
  pBVar5 = targetBlock->next;
  ppFVar14 = (Func **)&pBVar5->firstInstr;
  if (pBVar5 == (BasicBlock *)0x0) {
    ppFVar14 = &targetBlock->func;
  }
  lVar16 = 0x18;
  if (pBVar5 == (BasicBlock *)0x0) {
    lVar16 = 0xd0;
  }
  targetBlock_00 = edge->succBlock;
  this_00 = *(BranchInstr **)((long)&(*ppFVar14)->m_alloc + lVar16);
  uVar4 = this->blockCount;
  this->blockCount = uVar4 + 1;
  compBlock->number = uVar4;
  if ((int)CONCAT71(in_register_00000011,insertToLoopList) != 0) {
    if (sinkBlockLoop) {
      if (targetBlock_00->loop == (Loop *)0x0) {
        pLVar19 = (Loop *)0x0;
      }
      else {
        pBVar11 = Loop::GetHeadBlock(targetBlock_00->loop);
        pLVar19 = targetBlock_00->loop;
        if (pBVar11 == targetBlock_00) {
          pLVar19 = pLVar19->parent;
        }
      }
      compBlock->loop = pLVar19;
      InsertCompBlockToLoopList(this,pLVar19,compBlock,targetBlock_00,false);
      uVar9 = 0x400;
    }
    else {
      pLVar19 = targetBlock->loop;
      compBlock->loop = pLVar19;
      InsertCompBlockToLoopList(this,pLVar19,compBlock,targetBlock,true);
      uVar9 = 0x800;
    }
    *(ushort *)&compBlock->field_0x18 = *(ushort *)&compBlock->field_0x18 | uVar9;
  }
  compBlock->next = pBVar5;
  pBVar5->prev = compBlock;
  compBlock->prev = targetBlock;
  targetBlock->next = compBlock;
  BasicBlock::RemoveSucc(targetBlock,targetBlock_00,this,false,false);
  AddEdge(this,targetBlock,compBlock);
  edge->predBlock = compBlock;
  pSVar12 = (Type)new<Memory::ArenaAllocator>(0x10,&this->alloc->super_ArenaAllocator,0x364470);
  pSVar12[1].next = (Type)edge;
  pSVar12->next =
       (compBlock->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
       super_SListNodeBase<Memory::ArenaAllocator>.next;
  (compBlock->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar12;
  pRVar1 = &(compBlock->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
            super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  branchTarget = (LabelInstr *)targetBlock_00->firstInstr;
  IVar2 = (branchTarget->super_Instr).m_kind;
  if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
    if (!bVar7) goto LAB_00415f14;
    *puVar13 = 0;
  }
  func = (branchTarget->super_Instr).m_func;
  newLabelInstr = IR::LabelInstr::New(Label,func,false);
  IR::Instr::InsertAfter(&this_00->super_Instr,&newLabelInstr->super_Instr);
  compBlock->firstInstr = &newLabelInstr->super_Instr;
  if (newLabelInstr->m_block != (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x2c8,"(this->m_block == nullptr || block == nullptr)",
                       "Overwriting existing block pointer");
    if (!bVar7) goto LAB_00415f14;
    *puVar13 = 0;
  }
  newLabelInstr->m_block = compBlock;
  this_01 = IR::BranchInstr::New(Br,branchTarget,func);
  IR::Instr::SetByteCodeOffset(&this_01->super_Instr,(Instr *)branchTarget);
  IR::Instr::InsertAfter(&newLabelInstr->super_Instr,&this_01->super_Instr);
  IR::Instr::SetByteCodeOffset(&newLabelInstr->super_Instr,(Instr *)branchTarget);
  if ((this_00->super_Instr).m_kind != InstrKindBranch) goto LAB_00415ea0;
  if (this_00->m_branchTarget == (LabelInstr *)0x0) {
    if (this_00->m_isMultiBranch != false) goto LAB_00415d7c;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    pcVar20 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl";
    pcVar17 = "(m_isMultiBranch)";
    pcVar15 = "m_isMultiBranch";
    uVar18 = 0x20e;
LAB_00415d63:
    bVar7 = Js::Throw::ReportAssert(pcVar20,uVar18,pcVar17,pcVar15);
    if (!bVar7) goto LAB_00415f14;
    *puVar13 = 0;
  }
  else {
    if (this_00->m_isMultiBranch != false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x209,"(!m_isMultiBranch)","!m_isMultiBranch");
      if (!bVar7) goto LAB_00415f14;
      *puVar13 = 0;
    }
    OVar3 = (this_00->super_Instr).m_opcode;
    if (OVar3 < ADD) {
      if ((OVar3 == MultiBr) || (OVar3 == Br)) goto LAB_00415d22;
    }
    else {
      bVar7 = LowererMD::IsUnconditionalBranch(&this_00->super_Instr);
      if (bVar7) {
LAB_00415d22:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        pcVar20 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
        ;
        pcVar17 = "(sourceBr->IsMultiBranch() || sourceBr->IsConditional())";
        pcVar15 = "sourceBr->IsMultiBranch() || sourceBr->IsConditional()";
        uVar18 = 0x945;
        goto LAB_00415d63;
      }
    }
  }
LAB_00415d7c:
  if (this_00->m_branchTarget == (LabelInstr *)0x0) {
    if (this_00->m_isMultiBranch == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x20e,"(m_isMultiBranch)","m_isMultiBranch");
      if (!bVar7) goto LAB_00415f14;
      *puVar13 = 0;
    }
    this_02 = IR::BranchInstr::AsMultiBrInstr(this_00);
    bVar7 = IR::MultiBranchInstr::ReplaceTarget(this_02,branchTarget,newLabelInstr);
    if (bVar7) goto LAB_00415ea0;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    pcVar20 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
    ;
    pcVar17 = "(replaced)";
    pcVar15 = "replaced";
    uVar18 = 0x949;
  }
  else {
    if (this_00->m_isMultiBranch == false) goto LAB_00415ea0;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    pcVar20 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl";
    pcVar17 = "(!m_isMultiBranch)";
    pcVar15 = "!m_isMultiBranch";
    uVar18 = 0x209;
  }
  bVar7 = Js::Throw::ReportAssert(pcVar20,uVar18,pcVar17,pcVar15);
  if (!bVar7) {
LAB_00415f14:
    pcVar6 = (code *)invalidInstructionException();
    (*pcVar6)();
  }
  *puVar13 = 0;
LAB_00415ea0:
  if (afterForward) {
    newLabelInstr->m_region = branchTarget->m_region;
  }
  else {
    BVar10 = Func::HasTry(this->func);
    if (BVar10 != 0) {
      bVar7 = Func::DoOptimizeTry(this->func);
      if (!bVar7) {
        EVar8 = JITTimeWorkItem::GetJitMode(this->func->m_workItem);
        if (((EVar8 != SimpleJit) || ((this->func->field_0x240 & 0x10) == 0)) &&
           (bVar7 = Func::IsLoopBodyInTryFinally(this->func), !bVar7)) {
          return compBlock;
        }
      }
      UpdateRegionForBlock(this,compBlock);
    }
  }
  return compBlock;
}

Assistant:

BasicBlock *
FlowGraph::InsertCompensationCodeForBlockMove(FlowEdge * edge,  bool insertToLoopList /*=false*/, bool sinkBlockLoop /*=false*/, bool afterForward /*=false*/)
{
    BasicBlock * compBlock = BasicBlock::New(this);
    BasicBlock * sourceBlock = edge->GetPred();
    BasicBlock * sinkBlock = edge->GetSucc();
    BasicBlock * fallthroughBlock = sourceBlock->next;
    IR::Instr *  sourceLastInstr = sourceBlock->GetLastInstr();

    compBlock->SetBlockNum(this->blockCount++);

    if (insertToLoopList)
    {
        // For flow graph edits in
        if (sinkBlockLoop)
        {
            if (sinkBlock->loop && sinkBlock->loop->GetHeadBlock() == sinkBlock)
            {
                // BLUE 531255: sinkblock may be the head block of new loop, we shouldn't insert compensation block to that loop
                // Insert it to all the parent loop lists.
                compBlock->loop = sinkBlock->loop->parent;
                InsertCompBlockToLoopList(compBlock->loop, compBlock, sinkBlock, false);
            }
            else
            {
                compBlock->loop = sinkBlock->loop;
                InsertCompBlockToLoopList(compBlock->loop, compBlock, sinkBlock, false); // sinkBlock or fallthroughBlock?
            }
#ifdef DBG
            compBlock->isBreakCompensationBlockAtSink = true;
#endif
        }
        else
        {
            compBlock->loop = sourceBlock->loop;
            InsertCompBlockToLoopList(compBlock->loop, compBlock, sourceBlock, true);
#ifdef DBG
            compBlock->isBreakCompensationBlockAtSource = true;
#endif
        }
    }

    //
    // Fixup block linkage
    //

    // compensation block is inserted right after sourceBlock
    compBlock->next = fallthroughBlock;
    fallthroughBlock->prev = compBlock;

    compBlock->prev = sourceBlock;
    sourceBlock->next = compBlock;

    //
    // Fixup flow edges
    //
    sourceBlock->RemoveSucc(sinkBlock, this, false);

    // Add sourceBlock -> airlockBlock
    this->AddEdge(sourceBlock, compBlock);

    // Add airlockBlock -> sinkBlock
    edge->SetPred(compBlock);
    compBlock->AddSucc(edge, this);

    //
    // Fixup IR
    //

    // Maintain the instruction region for inlining
    IR::LabelInstr *sinkLabel = sinkBlock->GetFirstInstr()->AsLabelInstr();
    Func * sinkLabelFunc = sinkLabel->m_func;

    IR::LabelInstr *compLabel = IR::LabelInstr::New(Js::OpCode::Label, sinkLabelFunc);
    sourceLastInstr->InsertAfter(compLabel);
    compBlock->SetFirstInstr(compLabel);
    compLabel->SetBasicBlock(compBlock);

    // Add br to sinkBlock from compensation block
    IR::BranchInstr *compBr = IR::BranchInstr::New(Js::OpCode::Br, sinkLabel, sinkLabelFunc);
    compBr->SetByteCodeOffset(sinkLabel);
    compLabel->InsertAfter(compBr);
    compBlock->SetLastInstr(compBr);

    compLabel->SetByteCodeOffset(sinkLabel);

    // Fixup flow out of sourceBlock
    if (sourceLastInstr->IsBranchInstr())
    {
        IR::BranchInstr *sourceBr = sourceLastInstr->AsBranchInstr();
        Assert(sourceBr->IsMultiBranch() || sourceBr->IsConditional());
        if (sourceBr->IsMultiBranch())
        {
            const bool replaced = sourceBr->AsMultiBrInstr()->ReplaceTarget(sinkLabel, compLabel);
            Assert(replaced);
        }
    }

    if (!afterForward)
    {
        bool assignRegionsBeforeGlobopt = this->func->HasTry() && (this->func->DoOptimizeTry() ||
            (this->func->IsSimpleJit() && this->func->hasBailout) ||
            this->func->IsLoopBodyInTryFinally());

        if (assignRegionsBeforeGlobopt)
        {
            UpdateRegionForBlock(compBlock);
        }
    }
    else
    {
        compLabel->SetRegion(sinkLabel->GetRegion());
    }

    return compBlock;
}